

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall embree::Scene::createUserGeometryAccel(Scene *this)

{
  State *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  Accel *accel;
  undefined8 *puVar4;
  BuildVariant BVar5;
  BVH8Factory *this_01;
  BVH4Factory *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(this->super_AccelN).field_0x188 + 0x310));
  this_00 = *(State **)&(this->super_AccelN).field_0x188;
  if (iVar3 == 0) {
    bVar2 = State::hasISA(this_00,0x60000ff);
    if (((!bVar2) || (this_00->frequency_level == FREQUENCY_SIMD128)) ||
       ((this->scene_flags & RTC_SCENE_FLAG_COMPACT) != RTC_SCENE_FLAG_NONE)) {
      this_02 = *(BVH4Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x560);
      if (this->quality_flags != RTC_BUILD_QUALITY_LOW) goto LAB_00a167ef;
      BVar5 = DYNAMIC;
      goto LAB_00a167f4;
    }
    this_01 = *(BVH8Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x568);
    if (this->quality_flags != RTC_BUILD_QUALITY_LOW) goto LAB_00a16776;
    BVar5 = DYNAMIC;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&this_00->object_accel);
    lVar1 = *(long *)&(this->super_AccelN).field_0x188;
    if (iVar3 == 0) {
      this_02 = *(BVH4Factory **)(lVar1 + 0x560);
LAB_00a167ef:
      BVar5 = STATIC;
LAB_00a167f4:
      accel = BVH4Factory::BVH4UserGeometry(this_02,this,BVar5);
      goto LAB_00a167f9;
    }
    iVar3 = std::__cxx11::string::compare((char *)(lVar1 + 0x310));
    if (iVar3 != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&local_38,"unknown user geometry accel ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(this->super_AccelN).field_0x188 + 0x310));
      *puVar4 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar4 + 1) = 2;
      puVar4[2] = puVar4 + 4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar4 + 2),local_38._M_dataplus._M_p,
                 local_38._M_dataplus._M_p + local_38._M_string_length);
      __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    this_01 = *(BVH8Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x568);
LAB_00a16776:
    BVar5 = STATIC;
  }
  accel = BVH8Factory::BVH8UserGeometry(this_01,this,BVar5);
LAB_00a167f9:
  AccelN::accels_add(&this->super_AccelN,accel);
  return;
}

Assistant:

void Scene::createUserGeometryAccel()
  {
#if defined(EMBREE_GEOMETRY_USER)

    if (device->object_accel == "default")
    {
#if defined (EMBREE_TARGET_SIMD8)
      if (device->canUseAVX() && !isCompactAccel())
      {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh8_factory->BVH8UserGeometry(this,BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh8_factory->BVH8UserGeometry(this,BVHFactory::BuildVariant::DYNAMIC));
        }
      }
      else
#endif
      {
        if (quality_flags != RTC_BUILD_QUALITY_LOW) {
          accels_add(device->bvh4_factory->BVH4UserGeometry(this,BVHFactory::BuildVariant::STATIC));
        } else {
          accels_add(device->bvh4_factory->BVH4UserGeometry(this,BVHFactory::BuildVariant::DYNAMIC));
        }
      }
    }
    else if (device->object_accel == "bvh4.object") accels_add(device->bvh4_factory->BVH4UserGeometry(this));
#if defined (EMBREE_TARGET_SIMD8)
    else if (device->object_accel == "bvh8.object") accels_add(device->bvh8_factory->BVH8UserGeometry(this));
#endif
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown user geometry accel "+device->object_accel);
#endif
  }